

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int deleteCell(Rtree *pRtree,RtreeNode *pNode,int iCell,int iHeight)

{
  sqlite3_stmt *pStmt;
  u8 *puVar1;
  RtreeNode **ppRVar2;
  int iVar3;
  int iVar4;
  Mem *pMem;
  i64 iNode;
  RtreeNode *pRVar5;
  ulong uVar6;
  ushort uVar7;
  RtreeNode *ppNode;
  
  ppNode = pNode;
  do {
    if ((ppNode->iNode == 1) || (ppNode->pParent != (RtreeNode *)0x0)) {
      uVar6 = (ulong)pRtree->nBytesPerCell;
      puVar1 = pNode->zData;
      memmove(puVar1 + uVar6 * (long)iCell + 4,puVar1 + uVar6 + uVar6 * (long)iCell + 4,
              (long)(int)(~iCell + (uint)(ushort)(*(ushort *)(puVar1 + 2) << 8 |
                                                 *(ushort *)(puVar1 + 2) >> 8)) * uVar6);
      puVar1 = pNode->zData;
      uVar7 = ((ushort)puVar1[3] + (ushort)puVar1[2] * 0x100) - 1;
      *(ushort *)(puVar1 + 2) = uVar7 * 0x100 | uVar7 >> 8;
      pNode->isDirty = 1;
      if (pNode->pParent == (RtreeNode *)0x0) {
        return 0;
      }
      if ((int)(uint)(ushort)(*(ushort *)(pNode->zData + 2) << 8 |
                             *(ushort *)(pNode->zData + 2) >> 8) <
          ((pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell) / 3) {
        iVar4 = removeNode(pRtree,pNode,iHeight);
        return iVar4;
      }
      iVar4 = fixBoundingBox(pRtree,pNode);
      return iVar4;
    }
    sqlite3_bind_int64(pRtree->pReadParent,1,ppNode->iNode);
    iVar3 = sqlite3_step(pRtree->pReadParent);
    iVar4 = 0;
    if (iVar3 == 100) {
      pStmt = pRtree->pReadParent;
      pMem = columnMem(pStmt,0);
      iNode = sqlite3VdbeIntValue(pMem);
      columnMallocFailure(pStmt);
      pRVar5 = pNode;
      if (pNode != (RtreeNode *)0x0) {
        do {
          iVar4 = 0;
          if (pRVar5->iNode == iNode) goto LAB_001cd88c;
          ppRVar2 = &pRVar5->pParent;
          pRVar5 = *ppRVar2;
        } while (*ppRVar2 != (RtreeNode *)0x0);
      }
      iVar4 = nodeAcquire(pRtree,iNode,(RtreeNode *)0x0,&ppNode->pParent);
    }
LAB_001cd88c:
    iVar3 = sqlite3_reset(pRtree->pReadParent);
    if (iVar3 != 0) {
      iVar4 = iVar3;
    }
    if (iVar4 != 0) {
      return iVar4;
    }
    ppNode = ppNode->pParent;
    if (ppNode == (RtreeNode *)0x0) {
      return 0x10b;
    }
  } while( true );
}

Assistant:

static int deleteCell(Rtree *pRtree, RtreeNode *pNode, int iCell, int iHeight){
  RtreeNode *pParent;
  int rc;

  if( SQLITE_OK!=(rc = fixLeafParent(pRtree, pNode)) ){
    return rc;
  }

  /* Remove the cell from the node. This call just moves bytes around
  ** the in-memory node image, so it cannot fail.
  */
  nodeDeleteCell(pRtree, pNode, iCell);

  /* If the node is not the tree root and now has less than the minimum
  ** number of cells, remove it from the tree. Otherwise, update the
  ** cell in the parent node so that it tightly contains the updated
  ** node.
  */
  pParent = pNode->pParent;
  assert( pParent || pNode->iNode==1 );
  if( pParent ){
    if( NCELL(pNode)<RTREE_MINCELLS(pRtree) ){
      rc = removeNode(pRtree, pNode, iHeight);
    }else{
      rc = fixBoundingBox(pRtree, pNode);
    }
  }

  return rc;
}